

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O2

QPDFNameTreeObjectHelper *
QPDFNameTreeObjectHelper::newEmpty
          (QPDFNameTreeObjectHelper *__return_storage_ptr__,QPDF *qpdf,bool auto_repair)

{
  QPDFObjectHandle local_40;
  char local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  operator____qpdf(local_30,0x2271a0);
  QPDF::makeIndirectObject((QPDF *)&local_40,(QPDFObjectHandle *)qpdf);
  QPDFNameTreeObjectHelper(__return_storage_ptr__,&local_40,qpdf,auto_repair);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return __return_storage_ptr__;
}

Assistant:

QPDFNameTreeObjectHelper
QPDFNameTreeObjectHelper::newEmpty(QPDF& qpdf, bool auto_repair)
{
    return {qpdf.makeIndirectObject("<< /Names [] >>"_qpdf), qpdf, auto_repair};
}